

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O1

Gia_Man_t * Bmc_CexTarget(Gia_Man_t *p,int nFrames)

{
  Gia_Man_t *pGVar1;
  int iVar;
  int iVar2;
  Gia_Man_t *pNew;
  Gia_Man_t *local_30;
  
  iVar2 = (p->vCis->nSize - p->nRegs) * nFrames;
  local_30 = Bmc_CexTargetEnlarge(p,nFrames);
  if (0 < iVar2) {
    iVar = 0;
    do {
      printf("%3d : ");
      if (iVar % (p->vCis->nSize - p->nRegs) == 0) {
        Gia_ManPrintStats(local_30,(Gps_Par_t *)0x0);
      }
      pGVar1 = local_30;
      local_30 = Gia_ManDupExist(local_30,iVar);
      Gia_ManStop(pGVar1);
      iVar = iVar + 1;
    } while (iVar2 != iVar);
  }
  Gia_ManPrintStats(local_30,(Gps_Par_t *)0x0);
  pGVar1 = local_30;
  local_30 = Gia_ManDupLastPis(local_30,p->nRegs);
  Gia_ManStop(pGVar1);
  Gia_ManPrintStats(local_30,(Gps_Par_t *)0x0);
  pGVar1 = Gia_ManDupAppendCones(p,&local_30,1,1);
  Gia_ManStop(local_30);
  Gia_AigerWrite(pGVar1,"miter3.aig",0,0);
  return pGVar1;
}

Assistant:

Gia_Man_t * Bmc_CexTarget( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pTemp;
    int i, Limit = nFrames * Gia_ManPiNum(p);
    pNew = Bmc_CexTargetEnlarge( p, nFrames );
    for ( i = 0; i < Limit; i++ )
    {
        printf( "%3d : ", i );
        if ( i % Gia_ManPiNum(p) == 0 )
            Gia_ManPrintStats( pNew, NULL );
        pNew = Gia_ManDupExist( pTemp = pNew, i );
        Gia_ManStop( pTemp );
    }
    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManDupLastPis( pTemp = pNew, Gia_ManRegNum(p) );
    Gia_ManStop( pTemp );  
    Gia_ManPrintStats( pNew, NULL );
    pTemp = Gia_ManDupAppendCones( p, &pNew, 1, 1 );
    Gia_ManStop( pNew );
    Gia_AigerWrite( pTemp, "miter3.aig", 0, 0 );
    return pTemp;
}